

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecollection.cpp
# Opt level: O2

void __thiscall CFileCollection::AddEntry(CFileCollection *this,int64 Timestamp)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  char aTimestring [20];
  char aBuf [512];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_NumTimestamps == 0) {
    this->m_NumTimestamps = 1;
    this->m_aTimestamps[0] = Timestamp;
    goto LAB_001308ba;
  }
  if (this->m_NumTimestamps == this->m_MaxEntries) {
    BuildTimestring(this,this->m_aTimestamps[0],aTimestring);
    str_format(aBuf,0x200,"%s/%s_%s%s",this->m_aPath,this->m_aFileDesc,aTimestring,this->m_aFileExt)
    ;
    (*(this->m_pStorage->super_IInterface)._vptr_IInterface[9])(this->m_pStorage,aBuf,0);
  }
  iVar1 = this->m_NumTimestamps;
  lVar5 = (long)iVar1;
  if (Timestamp < this->m_aTimestamps[0]) {
    if (this->m_MaxEntries <= iVar1) goto LAB_001308ba;
    mem_move(this->m_aTimestamps + 1,this,iVar1 << 3);
    this->m_aTimestamps[0] = Timestamp;
  }
  else {
    uVar7 = lVar5 - 1;
    if (this->m_aTimestamps[lVar5 + -1] <= Timestamp) {
      if (iVar1 == this->m_MaxEntries) {
        mem_move(this,this->m_aTimestamps + 1,(int)uVar7 << 3);
        this->m_aTimestamps[(long)this->m_NumTimestamps + -1] = Timestamp;
      }
      else {
        this->m_NumTimestamps = iVar1 + 1;
        this->m_aTimestamps[lVar5] = Timestamp;
      }
      goto LAB_001308ba;
    }
    iVar4 = 0;
    while (iVar6 = iVar4, iVar4 = (int)uVar7, 1 < iVar4 - iVar6) {
      uVar3 = (long)(iVar6 + iVar4) / 2;
      iVar4 = (int)uVar3;
      if (Timestamp < this->m_aTimestamps[iVar4]) {
        uVar7 = uVar3;
      }
      uVar7 = uVar7 & 0xffffffff;
      if (Timestamp < this->m_aTimestamps[iVar4]) {
        iVar4 = iVar6;
      }
    }
    if (iVar1 == this->m_MaxEntries) {
      mem_move(this,this->m_aTimestamps + 1,iVar4 * 8 - 8);
      this->m_aTimestamps[(long)iVar4 + -1] = Timestamp;
      goto LAB_001308ba;
    }
    mem_move(this->m_aTimestamps + iVar4 + 1,this->m_aTimestamps + iVar4,(iVar1 - iVar4) * 8);
    this->m_aTimestamps[iVar4] = Timestamp;
  }
  this->m_NumTimestamps = this->m_NumTimestamps + 1;
LAB_001308ba:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CFileCollection::AddEntry(int64 Timestamp)
{
	if(m_NumTimestamps == 0)
	{
		// empty list
		m_aTimestamps[m_NumTimestamps++] = Timestamp;
	}
	else
	{
		// remove old file
		if(m_NumTimestamps == m_MaxEntries)
		{
			char aBuf[IO_MAX_PATH_LENGTH];
			char aTimestring[TIMESTAMP_LENGTH];
			BuildTimestring(m_aTimestamps[0], aTimestring);
			str_format(aBuf, sizeof(aBuf), "%s/%s_%s%s", m_aPath, m_aFileDesc, aTimestring, m_aFileExt);
			m_pStorage->RemoveFile(aBuf, IStorage::TYPE_SAVE);
		}

		// add entry to the sorted list
		if(m_aTimestamps[0] > Timestamp)
		{
			// first entry
			if(m_NumTimestamps < m_MaxEntries)
			{
				mem_move(m_aTimestamps+1, m_aTimestamps, m_NumTimestamps*sizeof(int64));
				m_aTimestamps[0] = Timestamp;
				++m_NumTimestamps;
			}
		}
		else if(m_aTimestamps[m_NumTimestamps-1] <= Timestamp)
		{
			// last entry
			if(m_NumTimestamps == m_MaxEntries)
			{
				mem_move(m_aTimestamps, m_aTimestamps+1, (m_NumTimestamps-1)*sizeof(int64));
				m_aTimestamps[m_NumTimestamps-1] = Timestamp;
			}
			else
				m_aTimestamps[m_NumTimestamps++] = Timestamp;
		}
		else
		{
			// middle entry
			int Left = 0, Right = m_NumTimestamps-1;
			while(Right-Left > 1)
			{
				int Mid = (Left+Right)/2;
				if(m_aTimestamps[Mid] > Timestamp)
					Right = Mid;
				else
					Left = Mid;
			}

			if(m_NumTimestamps == m_MaxEntries)
			{
				mem_move(m_aTimestamps, m_aTimestamps+1, (Right-1)*sizeof(int64));
				m_aTimestamps[Right-1] = Timestamp;
			}
			else
			{
				mem_move(m_aTimestamps+Right+1, m_aTimestamps+Right, (m_NumTimestamps-Right)*sizeof(int64));
				m_aTimestamps[Right] = Timestamp;
				++m_NumTimestamps;
			}
		}
	}
}